

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O1

void __thiscall
QFontComboBox::setSampleTextForSystem
          (QFontComboBox *this,WritingSystem writingSystem,QString *sampleText)

{
  long in_FS_OFFSET;
  WritingSystem local_34;
  TryEmplaceResult local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = writingSystem;
  QHash<QFontDatabase::WritingSystem,QString>::tryEmplace_impl<QFontDatabase::WritingSystem_const&>
            (&local_30,(void *)(*(long *)&(this->super_QComboBox).super_QWidget.field_0x8 + 0x368),
             &local_34);
  QString::operator=((QString *)
                     ((local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].entries
                      [(local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].offsets
                       [(uint)local_30.iterator.i.bucket & 0x7f]].storage.data + 8),
                     (QString *)sampleText);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontComboBox::setSampleTextForSystem(QFontDatabase::WritingSystem writingSystem, const QString &sampleText)
{
    Q_D(QFontComboBox);
    d->sampleTextForWritingSystem[writingSystem] = sampleText;
}